

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

void QWindowSystemInterface::handleGeometryChange<QWindowSystemInterface::AsynchronousDelivery>
               (QWindow *window,QRect *newRect)

{
  long lVar1;
  QPlatformWindow *pQVar2;
  QWindow *in_RSI;
  QWindow *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect newRectDi;
  QWindow *in_stack_ffffffffffffffe0;
  undefined8 uVar4;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = QHighDpi::fromNativeWindowGeometry<QRect,QWindow>
                    ((QRect *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffe0);
  uVar4 = QVar3._0_8_;
  uStack_10 = QVar3._8_8_;
  pQVar2 = QWindow::handle(in_RDI);
  if (pQVar2 != (QPlatformWindow *)0x0) {
    QWindow::handle(in_RDI);
    QPlatformWindow::setGeometry((QPlatformWindow *)in_RDI,(QRect *)in_RSI);
  }
  QVar3.x2.m_i = (int)uVar4;
  QVar3.y2.m_i = (int)((ulong)uVar4 >> 0x20);
  QVar3.x1.m_i = (undefined4)uStack_10;
  QVar3.y1.m_i = uStack_10._4_4_;
  handleWindowSystemEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindowSystemInterface::AsynchronousDelivery,QWindow*,QRect>
            (in_RSI,QVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(void, handleGeometryChange, QWindow *window, const QRect &newRect)
{
    Q_ASSERT(window);
    const auto newRectDi = QHighDpi::fromNativeWindowGeometry(newRect, window);
    if (window->handle()) {
        // Persist the new geometry so that QWindow::geometry() can be queried in the resize event
        window->handle()->QPlatformWindow::setGeometry(newRect);
        // FIXME: This does not work during platform window creation, where the QWindow does not
        // have its handle set up yet. Platforms that deliver events during window creation need
        // to handle the persistence manually, e.g. by overriding geometry().
    }
    handleWindowSystemEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent, Delivery>(window, newRectDi);
}